

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

double Logger::log(double __x)

{
  char cVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  element_type *this;
  uint uVar6;
  undefined8 uVar7;
  char in_AL;
  uint uVar8;
  undefined8 uVar9;
  ulong *puVar10;
  LogEvent *this_00;
  long *in_RCX;
  ulong uVar11;
  ulong uVar12;
  long *in_RDX;
  uint32_t in_ESI;
  Level in_EDI;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  uint __len;
  long lVar13;
  ulong uVar14;
  _Alloc_hider this_02;
  uint uVar15;
  ulong __val;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  va_list valist;
  ptr event;
  string parmString;
  string content;
  undefined8 local_208;
  ulong *local_200;
  undefined1 local_1e8 [32];
  element_type *local_1c8;
  _Alloc_hider _Stack_1c0;
  uint32_t local_1b8;
  Level local_1b4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  long local_180;
  undefined1 local_178 [16];
  SP_Appender local_168;
  ptr local_158;
  ptr local_148;
  pthread_t local_138;
  long *local_130;
  string local_128;
  string local_108;
  ulong local_e8 [6];
  undefined1 local_b8 [16];
  
  if (in_AL != '\0') {
    local_b8._8_4_ = in_XMM0_Dc;
    local_b8._0_8_ = __x;
    local_b8._12_4_ = in_XMM0_Dd;
  }
  if ((int)m_level <= (int)in_EDI) {
    local_1b8 = in_ESI;
    local_1b4 = in_EDI;
    local_130 = in_RDX;
    local_138 = pthread_self();
    uVar14 = 0;
    uVar9 = time((time_t *)0x0);
    __x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    local_190._8_8_ = local_178;
    local_180 = 0;
    local_178[0] = 0;
    iVar2 = (int)in_RCX[1];
    local_200 = (ulong *)&stack0x00000008;
    local_208 = 0x3000000020;
    local_1b0._M_allocated_capacity = (size_type)local_1a0;
    local_1b0._8_8_ = 0;
    local_1a0[0] = 0;
    uVar7 = uVar9;
    if (0 < iVar2) {
      do {
        local_190._M_allocated_capacity = uVar7;
        lVar13 = (long)(int)uVar14;
        uVar11 = lVar13 + 1;
        if ((iVar2 <= (int)uVar11) || (lVar3 = *in_RCX, *(char *)(lVar3 + lVar13) != '%')) {
          __x = (double)std::__cxx11::string::push_back((char)&local_190 + '\b');
          uVar11 = uVar14;
          goto switchD_00104d5c_caseD_65;
        }
        cVar1 = *(char *)(lVar3 + uVar11);
        switch(cVar1) {
        case 'c':
          if ((uint)local_208 < 0x29) {
            local_208 = CONCAT44(local_208._4_4_,(uint)local_208 + 8);
          }
          else {
            local_200 = local_200 + 1;
          }
LAB_00104ee5:
          __x = (double)std::__cxx11::string::push_back((char)&local_190 + '\b');
          break;
        case 'd':
          uVar14 = local_208 & 0xffffffff;
          if (uVar14 < 0x29) {
            local_208 = CONCAT44(local_208._4_4_,(uint)local_208 + 8);
            puVar10 = (ulong *)((long)local_e8 + uVar14);
          }
          else {
            puVar10 = local_200;
            local_200 = local_200 + 1;
          }
          uVar15 = (uint)*puVar10;
          uVar5 = -uVar15;
          if (0 < (int)uVar15) {
            uVar5 = uVar15;
          }
          __len = 1;
          if (9 < uVar5) {
            uVar14 = (ulong)uVar5;
            uVar6 = 4;
            do {
              __len = uVar6;
              uVar8 = (uint)uVar14;
              if (uVar8 < 100) {
                __len = __len - 2;
                goto LAB_00104fad;
              }
              if (uVar8 < 1000) {
                __len = __len - 1;
                goto LAB_00104fad;
              }
              if (uVar8 < 10000) goto LAB_00104fad;
              uVar14 = uVar14 / 10000;
              uVar6 = __len + 4;
            } while (99999 < uVar8);
            __len = __len + 1;
          }
LAB_00104fad:
          local_1e8._0_8_ = local_1e8 + 0x10;
          std::__cxx11::string::_M_construct
                    ((ulong)local_1e8,(char)__len - (char)((int)uVar15 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)(local_1e8._0_8_ + (ulong)(uVar15 >> 0x1f)),__len,uVar5);
          std::__cxx11::string::operator=((string *)local_1b0._M_local_buf,(string *)local_1e8);
          uVar9 = local_190._M_allocated_capacity;
          if ((LogEvent *)local_1e8._0_8_ != (LogEvent *)(local_1e8 + 0x10)) {
            operator_delete((void *)local_1e8._0_8_);
            uVar9 = local_190._M_allocated_capacity;
          }
          goto LAB_0010500b;
        case 'e':
        case 'g':
        case 'h':
        case 'i':
        case 'j':
        case 'k':
          break;
        case 'f':
          uVar14 = (ulong)local_208._4_4_;
          if (uVar14 < 0xa1) {
            local_208 = CONCAT44(local_208._4_4_ + 0x10,(uint)local_208);
            puVar10 = (ulong *)((long)local_e8 + uVar14);
          }
          else {
            puVar10 = local_200;
            local_200 = local_200 + 1;
          }
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                     vsnprintf,0x148,"%f",(int)*puVar10);
LAB_00104f5d:
          std::__cxx11::string::operator=((string *)local_1b0._M_local_buf,(string *)local_1e8);
          if ((LogEvent *)local_1e8._0_8_ != (LogEvent *)(local_1e8 + 0x10)) {
            operator_delete((void *)local_1e8._0_8_);
          }
LAB_0010500b:
          __x = (double)std::__cxx11::string::_M_append
                                  (local_190._M_local_buf + 8,local_1b0._M_allocated_capacity);
          break;
        case 'l':
          uVar14 = lVar13 + 2;
          if ((int)uVar14 < iVar2) {
            if (*(char *)(lVar3 + uVar14) == 'd') {
              uVar11 = local_208 & 0xffffffff;
              if (uVar11 < 0x29) {
                local_208 = CONCAT44(local_208._4_4_,(uint)local_208 + 8);
                puVar10 = (ulong *)((long)local_e8 + uVar11);
              }
              else {
                puVar10 = local_200;
                local_200 = local_200 + 1;
              }
              uVar11 = *puVar10;
              __val = -uVar11;
              if (0 < (long)uVar11) {
                __val = uVar11;
              }
              uVar15 = 1;
              if (9 < __val) {
                uVar12 = __val;
                uVar5 = 4;
                do {
                  uVar15 = uVar5;
                  if (uVar12 < 100) {
                    uVar15 = uVar15 - 2;
                    goto LAB_00105109;
                  }
                  if (uVar12 < 1000) {
                    uVar15 = uVar15 - 1;
                    goto LAB_00105109;
                  }
                  if (uVar12 < 10000) goto LAB_00105109;
                  bVar4 = 99999 < uVar12;
                  uVar12 = uVar12 / 10000;
                  uVar5 = uVar15 + 4;
                } while (bVar4);
                uVar15 = uVar15 + 1;
              }
LAB_00105109:
              local_1e8._0_8_ = local_1e8 + 0x10;
              std::__cxx11::string::_M_construct
                        ((ulong)local_1e8,(char)uVar15 - (char)((long)uVar11 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long_long>
                        ((char *)(local_1e8._0_8_ + -((long)uVar11 >> 0x3f)),uVar15,__val);
              std::__cxx11::string::operator=((string *)local_1b0._M_local_buf,(string *)local_1e8);
              uVar9 = local_190._M_allocated_capacity;
              if ((LogEvent *)local_1e8._0_8_ != (LogEvent *)(local_1e8 + 0x10)) {
                operator_delete((void *)local_1e8._0_8_);
                uVar9 = local_190._M_allocated_capacity;
              }
            }
            else {
              if (*(char *)(lVar3 + uVar14) != 'f') goto LAB_001053e9;
              uVar11 = (ulong)local_208._4_4_;
              if (uVar11 < 0xa1) {
                local_208 = CONCAT44(local_208._4_4_ + 0x10,(uint)local_208);
                puVar10 = (ulong *)((long)local_e8 + uVar11);
              }
              else {
                puVar10 = local_200;
                local_200 = local_200 + 1;
              }
              __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e8,vsnprintf,0x148,"%f",(int)*puVar10);
              std::__cxx11::string::operator=((string *)local_1b0._M_local_buf,(string *)local_1e8);
              if ((LogEvent *)local_1e8._0_8_ != (LogEvent *)(local_1e8 + 0x10)) {
                operator_delete((void *)local_1e8._0_8_);
              }
            }
            __x = (double)std::__cxx11::string::_M_append
                                    (local_190._M_local_buf + 8,local_1b0._M_allocated_capacity);
            uVar11 = uVar14 & 0xffffffff;
          }
          break;
        default:
          if (cVar1 == '%') goto LAB_00104ee5;
          if (cVar1 == 's') {
            uVar14 = local_208 & 0xffffffff;
            if (uVar14 < 0x29) {
              local_208 = CONCAT44(local_208._4_4_,(uint)local_208 + 8);
              puVar10 = (ulong *)((long)local_e8 + uVar14);
            }
            else {
              puVar10 = local_200;
              local_200 = local_200 + 1;
            }
            std::__cxx11::string::string
                      ((string *)local_1e8,(char *)*puVar10,(allocator *)&local_1c8);
            goto LAB_00104f5d;
          }
        }
switchD_00104d5c_caseD_65:
        uVar15 = (int)uVar11 + 1;
        uVar14 = (ulong)uVar15;
        uVar7 = local_190._M_allocated_capacity;
      } while ((int)uVar15 < iVar2);
    }
    this_00 = (LogEvent *)operator_new(0x58);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,*local_130,local_130[1] + *local_130);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,local_190._8_8_,(undefined1 *)(local_180 + local_190._8_8_));
    LogEvent::LogEvent(this_00,local_1b8,(uint32_t)local_138,uVar9 & 0xffffffff,local_1b4,&local_128
                       ,&local_108);
    local_1e8._0_8_ = this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<LogEvent*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 8),this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if (m_target == FILE) {
      local_1c8 = (element_type *)operator_new(0x18);
      local_148.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1e8._0_8_;
      local_148.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_1e8._8_8_ + 8) = *(_Atomic_word *)(local_1e8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_1e8._8_8_ + 8) = *(_Atomic_word *)(local_1e8._8_8_ + 8) + 1;
        }
      }
      FileAppender::FileAppender((FileAppender *)local_1c8,&local_148);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FileAppender*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_1c0,(FileAppender *)local_1c8
                );
      local_168.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1c8;
      this_01._M_pi =
           local_148.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      this_02._M_p = _Stack_1c0._M_p;
    }
    else {
      local_1c8 = (element_type *)operator_new(0x18);
      local_158.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1e8._0_8_;
      local_158.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_1e8._8_8_ + 8) = *(_Atomic_word *)(local_1e8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_1e8._8_8_ + 8) = *(_Atomic_word *)(local_1e8._8_8_ + 8) + 1;
        }
      }
      ConsoleAppender::ConsoleAppender((ConsoleAppender *)local_1c8,&local_158);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ConsoleAppender*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_1c0,
                 (ConsoleAppender *)local_1c8);
      local_168.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1c8;
      this_01._M_pi =
           local_158.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      this_02._M_p = _Stack_1c0._M_p;
    }
    _Stack_1c0._M_p = (pointer)0x0;
    local_1c8 = (element_type *)0x0;
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
    }
    this = m_threadPool.super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p)->_M_use_count + 1;
      }
    }
    local_168.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p;
    ThreadPool::add(this,&local_168);
    uVar16 = extraout_XMM0_Da_00;
    uVar17 = extraout_XMM0_Db_00;
    if (local_168.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_168.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      uVar16 = extraout_XMM0_Da_01;
      uVar17 = extraout_XMM0_Db_01;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p);
      uVar16 = extraout_XMM0_Da_02;
      uVar17 = extraout_XMM0_Db_02;
    }
    __x = (double)CONCAT44(uVar17,uVar16);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
      __x = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
    }
LAB_001053e9:
    if ((undefined1 *)local_1b0._M_allocated_capacity != local_1a0) {
      operator_delete((void *)local_1b0._M_allocated_capacity);
      __x = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
    }
    if ((undefined1 *)local_190._8_8_ != local_178) {
      operator_delete((void *)local_190._8_8_);
      __x = (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
    }
  }
  return __x;
}

Assistant:

void Logger::log(LogLevel::Level level,uint32_t line,std::string funName,std::string format,...)
{
	if(level<m_level)
		return;
	uint32_t threadId=pthread_self();
	uint32_t nowTime=time(0);
	std::string content;
	int fmt_status=0;
	int formatLength=format.length();
	va_list valist;
	va_start(valist,format);
	std::string parmString;
	for(int i=0;i<formatLength;i++){
	 	if(i+1<formatLength&&format[i]=='%'){
			switch(format[++i]){
			case 'd':
				parmString=std::to_string(va_arg(valist,int));
				content.append(parmString);
				break;
			case 's':
				parmString=std::string(va_arg(valist,char*));
				content.append(parmString);
				break;
			case 'c':
				content.push_back(static_cast<char>(va_arg(valist,int)));
				break;
			case 'f':
				parmString=std::to_string(va_arg(valist,double));
				content.append(parmString);
				break;
			case 'l':
				if(i+1<formatLength){
					if(format[i+1]=='f'){
						i++;
						parmString=std::to_string(va_arg(valist,double));
						content.append(parmString);
					}
					else if(format[i+1]=='d'){
						i++;
						parmString=std::to_string(va_arg(valist,long long));
						content.append(parmString);
					}
					else
						return;
				}
				break;
			case '%':
				content.push_back('%');
				break;
			}
		}
		else{
			content.push_back(format[i]);
		}
	}
	LogEvent::ptr event(new LogEvent(line,threadId,nowTime,level,funName,content));
	Appender::ptr appender=nullptr;
	if(m_target==LogTarget::FILE){
		appender=Appender::ptr(new FileAppender(event));
	}
	else{
		appender=Appender::ptr(new ConsoleAppender(event));
	}
	m_threadPool->add(appender);
}